

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmTest *pcVar1;
  cmMakefile *mf;
  pointer pcVar2;
  cmState *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  cmListFileBacktrace *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  cmGeneratorTarget *this_00;
  string *psVar11;
  cmValue cVar12;
  Indent IVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  string *psVar14;
  WrapQuotes wrapQuotes;
  pointer pbVar15;
  pointer pbVar16;
  string_view arg_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string emulatorExe;
  string exe;
  string equalSigns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  cmGeneratorExpression ge;
  undefined1 local_148 [16];
  undefined1 local_138 [32];
  string local_118;
  string local_f8;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined1 local_78 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40 [2];
  
  this->TestGenerated = true;
  local_138._24_8_ = this;
  local_98 = config;
  pcVar8 = cmTest::GetBacktrace(this->Test);
  local_78._8_8_ =
       (pcVar8->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_68 = (pcVar8->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_68->_M_use_count = local_68->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_68->_M_use_count = local_68->_M_use_count + 1;
    }
  }
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_60,(cmListFileBacktrace *)(local_78 + 8));
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  pcVar1 = *(cmTest **)(local_138._24_8_ + 0x78);
  mf = pcVar1->Makefile;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar2 = (pcVar1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + (pcVar1->Name)._M_string_length);
  bVar5 = anon_unknown.dwarf_1bb26c8::needToQuoteTestName(mf,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_118._M_dataplus._M_p = local_138 + 0x30;
  pcVar2 = ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_138 + 0x20),pcVar2,
             pcVar2 + ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_string_length);
  sVar9 = anon_unknown.dwarf_1bb26c8::countMaxConsecutiveEqualSigns((string *)(local_138 + 0x20));
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)sVar9 + '\x01');
  if (local_118._M_dataplus._M_p != local_138 + 0x30) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar5) {
    IVar13.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar13.Level = IVar13.Level + -1;
      } while (IVar13.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test([",10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
    local_118._M_dataplus._M_p = local_138 + 0x30;
    pcVar2 = ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_138 + 0x20),pcVar2,
               pcVar2 + ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] ",2);
  }
  else {
    IVar13.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar13.Level = IVar13.Level + -1;
      } while (IVar13.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
    local_118._M_dataplus._M_p = local_138 + 0x30;
    pcVar2 = ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_138 + 0x20),pcVar2,
               pcVar2 + ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  }
  if (local_118._M_dataplus._M_p != local_138 + 0x30) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  uVar4 = local_138._24_8_;
  psVar11 = local_98;
  EvaluateCommandLineArguments
            (&local_b8,(cmTestGenerator *)local_138._24_8_,
             &(*(cmTest **)(local_138._24_8_ + 0x78))->Command,(cmGeneratorExpression *)local_60,
             local_98);
  bVar6 = cmTest::GetCommandExpandLists(*(cmTest **)(uVar4 + 0x78));
  if (bVar6) {
    cmExpandedLists<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    local_118.field_2._M_allocated_capacity =
         (size_type)
         local_b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_118._M_string_length =
         (size_type)
         local_b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118._M_dataplus._M_p =
         (pointer)local_b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._0_8_;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
    local_148._0_8_ = (cmOutputConverter *)0x0;
    local_148._8_8_ = (cmOutputConverter *)0x0;
    local_138._0_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_138 + 0x20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_b8);
    }
  }
  local_118._M_dataplus._M_p = local_138 + 0x30;
  pcVar3 = ((cmStateSnapshot *)
           &(local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->State;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_138 + 0x20),pcVar3,
             (long)&(((((cmStateSnapshot *)
                       &(local_b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->Position).Tree)->
                    Data).
                    super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)&(pcVar3->PropertyDefinitions).Map_._M_t._M_impl);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse
                      (*(cmLocalGenerator **)(local_138._24_8_ + 0x70),(string *)(local_138 + 0x20))
  ;
  if ((this_00 == (cmGeneratorTarget *)0x0) ||
     (TVar7 = cmGeneratorTarget::GetType(this_00), TVar7 != EXECUTABLE)) {
    cmsys::SystemTools::ConvertToUnixSlashes((string *)(local_138 + 0x20));
  }
  else {
    psVar11 = (string *)0x0;
    cmGeneratorTarget::GetFullPath((string *)local_148,this_00,local_98,RuntimeBinaryArtifact,false)
    ;
    std::__cxx11::string::operator=((string *)(local_138 + 0x20),(string *)local_148);
    if ((cmOutputConverter *)local_148._0_8_ != (cmOutputConverter *)local_138) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
    }
    local_148._0_8_ = (cmOutputConverter *)local_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"CROSSCOMPILING_EMULATOR","");
    cVar12 = cmGeneratorTarget::GetProperty(this_00,(string *)local_148);
    if ((cmOutputConverter *)local_148._0_8_ != (cmOutputConverter *)local_138) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
    }
    if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
      arg_00._M_str = ((cVar12.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar12.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&local_90,arg_00,false);
      pcVar2 = ((local_90.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_148._0_8_ = (cmOutputConverter *)local_138;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_148,pcVar2,
                 pcVar2 + (local_90.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_148);
      str_02._M_str = (char *)0x0;
      str_02._M_len = local_148._0_8_;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)(local_138 + 0x40),(cmOutputConverter *)local_148._8_8_,str_02,
                 (WrapQuotes)psVar11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      if (local_f8._M_dataplus._M_p != local_138 + 0x50) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      pbVar16 = local_90.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar15 = local_90.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      if (pbVar15 !=
          local_90.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          str_03._M_str = (char *)0x0;
          str_03._M_len = (size_t)(pbVar15->_M_dataplus)._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    ((string *)(local_138 + 0x40),(cmOutputConverter *)pbVar15->_M_string_length,
                     str_03,(WrapQuotes)psVar11);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          if (local_f8._M_dataplus._M_p != local_138 + 0x50) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar16);
      }
      if ((cmOutputConverter *)local_148._0_8_ != (cmOutputConverter *)local_138) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
    }
  }
  str._M_str = (char *)0x0;
  str._M_len = (size_t)local_118._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            ((string *)local_148,(cmOutputConverter *)local_118._M_string_length,str,
             (WrapQuotes)psVar11);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_148._0_8_,local_148._8_8_);
  if ((cmOutputConverter *)local_148._0_8_ != (cmOutputConverter *)local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  pbVar16 = local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar14 = (string *)
            ((long)local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 0x20);
  if (psVar14 !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      str_00._M_str = (char *)0x0;
      str_00._M_len = (size_t)(psVar14->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_148,(cmOutputConverter *)psVar14->_M_string_length,str_00,
                 (WrapQuotes)psVar11);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_148._0_8_,local_148._8_8_)
      ;
      if ((cmOutputConverter *)local_148._0_8_ != (cmOutputConverter *)local_138) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != pbVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if (bVar5) {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties([",0x16);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
    local_148._0_8_ = local_138;
    pcVar2 = ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar2,
               pcVar2 + ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] PROPERTIES ",0xd);
  }
  else {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    local_148._0_8_ = local_138;
    pcVar2 = ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar2,
               pcVar2 + ((*(cmTest **)(local_138._24_8_ + 0x78))->Name)._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," PROPERTIES ",0xc);
  }
  if ((pointer)local_148._0_8_ != (pointer)local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  cmPropertyMap::GetList_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_90,&(*(cmTest **)(local_138._24_8_ + 0x78))->Properties);
  if (local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar16 = local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,(pbVar16->_M_dataplus)._M_p,pbVar16->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_50._M_allocated_capacity = (size_type)local_40;
      pcVar2 = pbVar16[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_60 + 0x10),pcVar2,pcVar2 + pbVar16[1]._M_string_length);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_78,(string *)local_60);
      local_f8._M_dataplus._M_p = local_138 + 0x50;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      wrapQuotes = Wrap;
      psVar11 = cmCompiledGeneratorExpression::Evaluate
                          ((cmCompiledGeneratorExpression *)local_78._0_8_,
                           *(cmLocalGenerator **)(local_138._24_8_ + 0x70),local_98,
                           (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                           (cmGeneratorTarget *)0x0,(string *)(local_138 + 0x40));
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)(psVar11->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_148,(cmOutputConverter *)psVar11->_M_string_length,str_01,
                 wrapQuotes);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(char *)local_148._0_8_,local_148._8_8_);
      if ((pointer)local_148._0_8_ != (pointer)local_138) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
      }
      if (local_f8._M_dataplus._M_p != local_138 + 0x50) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_78);
      if ((long *)local_50._M_allocated_capacity != local_40) {
        operator_delete((void *)local_50._M_allocated_capacity,local_40[0] + 1);
      }
      pbVar16 = pbVar16 + 2;
    } while (pbVar16 !=
             local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_90);
  GenerateInternalProperties((cmTestGenerator *)local_138._24_8_,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if (local_118._M_dataplus._M_p != local_138 + 0x30) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Start the test command.
  if (quote_test_name) {
    os << indent << "add_test([" << equalSigns << "[" << this->Test->GetName()
       << "]" << equalSigns << "] ";
  } else {
    os << indent << "add_test(" << this->Test->GetName() << " ";
  }

  // Evaluate command line arguments
  std::vector<std::string> argv =
    this->EvaluateCommandLineArguments(this->Test->GetCommand(), ge, config);

  // Expand arguments if COMMAND_EXPAND_LISTS is set
  if (this->Test->GetCommandExpandLists()) {
    argv = cmExpandedLists(argv.begin(), argv.end());
    // Expanding lists on an empty command may have left it empty
    if (argv.empty()) {
      argv.emplace_back();
    }
  }

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = argv[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    cmValue emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (cmNonempty(emulator)) {
      std::vector<std::string> emulatorWithArgs = cmExpandedList(*emulator);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::string const& arg : cmMakeRange(emulatorWithArgs).advance(1)) {
        os << cmOutputConverter::EscapeForCMake(arg) << " ";
      }
    }
  } else {
    // Use the command name given.
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);

  for (auto const& arg : cmMakeRange(argv).advance(1)) {
    os << " " << cmOutputConverter::EscapeForCMake(arg);
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    os << indent << "set_tests_properties([" << equalSigns << "["
       << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second)->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")\n";
}